

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::NewKey
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,int key)

{
  Node *pNVar1;
  PClassActor *pPVar2;
  undefined8 uVar3;
  short sVar4;
  char cVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  Node *pNVar10;
  uint uVar11;
  Node *pNVar12;
  uint uVar13;
  Node *pNVar14;
  Node *pNVar15;
  Node *pNVar16;
  
  pNVar10 = this->Nodes;
  uVar11 = this->Size - 1;
  uVar13 = uVar11 & key;
  pNVar16 = pNVar10 + uVar13;
  pNVar12 = pNVar10[uVar13].Next;
  if (pNVar12 == (Node *)0x1) {
    pNVar16->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar14 = pNVar1 + -1;
      pNVar15 = (Node *)0x0;
      if (pNVar1 <= pNVar10) break;
      pNVar15 = pNVar14;
      pNVar1 = pNVar14;
    } while (pNVar14->Next != (Node *)0x1);
    this->LastFree = pNVar14;
    if (pNVar15 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar10 = NewKey(this,key);
    }
    else {
      uVar11 = uVar11 & (pNVar16->Pair).Key;
      if (uVar11 == uVar13) {
        pNVar15->Next = pNVar12;
        pNVar10 = pNVar15;
        pNVar12 = pNVar15;
      }
      else {
        pNVar10 = pNVar10 + uVar11;
        do {
          pNVar12 = pNVar10;
          pNVar10 = pNVar12->Next;
        } while (pNVar10 != pNVar16);
        pNVar12->Next = pNVar15;
        pNVar10 = pNVar16->Next;
        iVar8 = (pNVar16->Pair).Key;
        uVar9 = *(undefined4 *)&(pNVar16->Pair).field_0x4;
        pPVar2 = (pNVar16->Pair).Value.Type;
        sVar4 = (pNVar16->Pair).Value.Special;
        cVar5 = (pNVar16->Pair).Value.ArgsDefined;
        uVar6 = (pNVar16->Pair).Value.field_0xb;
        iVar7 = (pNVar16->Pair).Value.Args[0];
        uVar3 = *(undefined8 *)((pNVar16->Pair).Value.Args + 3);
        *(undefined8 *)((pNVar15->Pair).Value.Args + 1) =
             *(undefined8 *)((pNVar16->Pair).Value.Args + 1);
        *(undefined8 *)((pNVar15->Pair).Value.Args + 3) = uVar3;
        (pNVar15->Pair).Value.Type = pPVar2;
        (pNVar15->Pair).Value.Special = sVar4;
        (pNVar15->Pair).Value.ArgsDefined = cVar5;
        (pNVar15->Pair).Value.field_0xb = uVar6;
        (pNVar15->Pair).Value.Args[0] = iVar7;
        pNVar15->Next = pNVar10;
        (pNVar15->Pair).Key = iVar8;
        *(undefined4 *)&(pNVar15->Pair).field_0x4 = uVar9;
        pNVar10 = (Node *)0x0;
        pNVar12 = pNVar16;
      }
      pNVar16->Next = pNVar10;
      pNVar16 = pNVar12;
    }
    if (pNVar15 == (Node *)0x0) {
      return pNVar10;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar16->Pair).Key = key;
  return pNVar16;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}